

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O3

void dsfmt_fill_array_close1_open2(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint64_t t1;
  uint64_t t1_3;
  uint64_t t1_2;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x1f8,"void dsfmt_fill_array_close1_open2(dsfmt_t *, double *, int)");
  }
  if (size < 0x17e) {
    __assert_fail("size >= DSFMT_N64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x1f9,"void dsfmt_fill_array_close1_open2(dsfmt_t *, double *, int)");
  }
  auVar3 = *(undefined1 (*) [16])dsfmt->status[0].u;
  auVar18._0_8_ = auVar3._0_8_ << 0x13;
  auVar18._8_8_ = auVar3._8_8_ << 0x13;
  auVar16._4_4_ = *(undefined4 *)((long)dsfmt->status + 0xbf8);
  auVar16._0_4_ = *(undefined4 *)((long)dsfmt->status + 0xbfc);
  auVar16._8_4_ = *(undefined4 *)((long)dsfmt->status + 0xbf4);
  auVar16._12_4_ = dsfmt->status[0xbf].u32[0];
  auVar16 = auVar16 ^ auVar18 ^ (undefined1  [16])dsfmt->status[0x75];
  uVar7 = auVar16._8_8_;
  auVar17._0_8_ = auVar16._0_8_ >> 0xc;
  auVar17._8_8_ = uVar7 >> 0xc;
  *(undefined1 (*) [16])array = auVar17 ^ auVar3 ^ _DAT_00132010 & auVar16;
  lVar12 = 0;
  uVar6 = auVar16._0_8_;
  do {
    uVar13 = *(ulong *)((long)dsfmt->status + lVar12 + 0x10);
    uVar4 = *(ulong *)((long)dsfmt->status + lVar12 + 0x18);
    uVar8 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar13 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar12 + 0x760);
    uVar7 = (uVar6 << 0x20 | uVar6 >> 0x20) ^ uVar4 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar12 + 0x768);
    *(ulong *)((long)array + lVar12 + 0x10) = uVar8 & 0xffafffffffb3f ^ uVar8 >> 0xc ^ uVar13;
    *(ulong *)((long)array + lVar12 + 0x18) = uVar7 & 0xffdfffc90fffd ^ uVar7 >> 0xc ^ uVar4;
    lVar12 = lVar12 + 0x10;
    uVar6 = uVar8;
  } while (lVar12 != 0x490);
  lVar12 = 0;
  do {
    uVar6 = *(ulong *)((long)dsfmt->status + lVar12 + 0x4a0);
    uVar13 = *(ulong *)((long)dsfmt->status + lVar12 + 0x4a8);
    uVar9 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar6 << 0x13 ^ *(ulong *)((long)array + lVar12);
    uVar7 = (uVar8 << 0x20 | uVar8 >> 0x20) ^ uVar13 << 0x13 ^ *(ulong *)((long)array + lVar12 + 8);
    *(uint64_t *)((long)array + lVar12 + 0x4a0) = uVar9 & 0xffafffffffb3f ^ uVar9 >> 0xc ^ uVar6;
    *(ulong *)((long)array + lVar12 + 0x4a8) = uVar7 & 0xffdfffc90fffd ^ uVar7 >> 0xc ^ uVar13;
    lVar12 = lVar12 + 0x10;
    uVar8 = uVar9;
  } while (lVar12 != 0x750);
  uVar11 = (uint)size >> 1;
  uVar15 = 0xbf;
  if (0x2fc < (uint)size) {
    uVar15 = uVar11 - 0xbf;
    lVar12 = 0;
    uVar6 = uVar9;
    do {
      uVar13 = *(ulong *)((long)array + lVar12 + 8);
      uVar9 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ *(ulong *)((long)array + lVar12) << 0x13 ^
              *(ulong *)((long)array + lVar12 + 0x750);
      uVar7 = (uVar6 << 0x20 | uVar6 >> 0x20) ^ uVar13 << 0x13 ^
              *(ulong *)((long)array + lVar12 + 0x758);
      *(uint64_t *)((long)array + lVar12 + 0xbf0) =
           uVar9 & 0xffafffffffb3f ^ uVar9 >> 0xc ^ *(ulong *)((long)array + lVar12);
      *(ulong *)((long)array + lVar12 + 0xbf8) = uVar7 & 0xffdfffc90fffd ^ uVar7 >> 0xc ^ uVar13;
      lVar12 = lVar12 + 0x10;
      uVar6 = uVar9;
    } while ((ulong)uVar15 * 0x10 + -0xbf0 != lVar12);
  }
  if ((uint)size < 0x2fc) {
    uVar6 = 1;
    if (1 < (int)(0x17e - uVar11)) {
      uVar6 = (ulong)(0x17e - uVar11);
    }
    lVar12 = 0;
    do {
      puVar1 = (undefined8 *)((long)array + lVar12 + (ulong)uVar11 * 0x10 + -0xbf0);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar12 = lVar12 + 0x10;
    } while (uVar6 << 4 != lVar12);
  }
  else {
    uVar6 = 0;
  }
  if ((int)uVar15 < (int)uVar11) {
    uVar13 = (ulong)uVar15;
    lVar12 = uVar11 - uVar13;
    lVar14 = 0;
    uVar10 = uVar9;
    do {
      uVar4 = *(ulong *)((long)array + lVar14 + uVar13 * 0x10 + -0xbf0);
      uVar8 = *(ulong *)((long)array + lVar14 + uVar13 * 0x10 + -0xbe8);
      uVar9 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar4 << 0x13 ^
              *(ulong *)((long)array + lVar14 + uVar13 * 0x10 + -0x4a0);
      uVar7 = (uVar10 << 0x20 | uVar10 >> 0x20) ^ uVar8 << 0x13 ^
              *(ulong *)((long)array + lVar14 + uVar13 * 0x10 + -0x498);
      *(uint64_t *)((long)array + lVar14 + uVar13 * 0x10) =
           uVar9 & 0xffafffffffb3f ^ uVar9 >> 0xc ^ uVar4;
      *(ulong *)((long)array + lVar14 + uVar13 * 0x10 + 8) =
           uVar7 & 0xffdfffc90fffd ^ uVar7 >> 0xc ^ uVar8;
      puVar1 = (undefined8 *)((long)array + lVar14 + uVar13 * 0x10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + lVar14 + uVar6 * 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar14 = lVar14 + 0x10;
      lVar12 = lVar12 + -1;
      uVar10 = uVar9;
    } while (lVar12 != 0);
  }
  dsfmt->status[0xbf].u[0] = uVar9;
  *(ulong *)((long)dsfmt->status + 0xbf8) = uVar7;
  return;
}

Assistant:

void dsfmt_fill_array_close1_open2(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_c1o2(dsfmt, (w128_t *)array, size / 2);
}